

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O0

DecodeStatus decodeMemRIXOperands(MCInst *Inst,uint64_t Imm,int64_t Address,void *Decoder)

{
  uint uVar1;
  ulong uVar2;
  MCOperand *Op;
  int64_t Val;
  ulong in_RSI;
  MCInst *in_RDI;
  uint64_t Disp;
  uint64_t Base;
  
  uVar2 = in_RSI >> 0xe;
  uVar1 = MCInst_getOpcode(in_RDI);
  if (uVar1 == 0x266) {
    MCOperand_CreateReg0(in_RDI,GP0Regs[uVar2]);
  }
  else {
    uVar1 = MCInst_getOpcode(in_RDI);
    if (uVar1 == 0x424) {
      Op = MCOperand_CreateReg1(in_RDI,GP0Regs[uVar2]);
      MCInst_insert0(in_RDI,0,Op);
    }
  }
  Val = SignExtend64((in_RSI & 0x3fff) << 2,0x10);
  MCOperand_CreateImm0(in_RDI,Val);
  MCOperand_CreateReg0(in_RDI,GP0Regs[uVar2]);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeMemRIXOperands(MCInst *Inst, uint64_t Imm,
		int64_t Address, const void *Decoder)
{
	// Decode the memrix field (imm, reg), which has the low 14-bits as the
	// displacement and the next 5 bits as the register #.

	uint64_t Base = Imm >> 14;
	uint64_t Disp = Imm & 0x3FFF;

	// assert(Base < 32 && "Invalid base register");

	if (MCInst_getOpcode(Inst) == PPC_LDU)
		// Add the tied output operand.
		MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	else if (MCInst_getOpcode(Inst) == PPC_STDU)
		MCInst_insert0(Inst, 0, MCOperand_CreateReg1(Inst, GP0Regs[Base]));

	MCOperand_CreateImm0(Inst, SignExtend64(Disp << 2, 16));
	MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	return MCDisassembler_Success;
}